

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O1

string * TidyConfigParser::formatCheckName(string *__return_storage_ptr__,string *checkName)

{
  pointer pcVar1;
  ulong uVar2;
  _Alloc_hider _Var3;
  int iVar4;
  void *pvVar5;
  size_type sVar6;
  size_type sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __size;
  string capitalizedName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  if (checkName->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_78,checkName->_M_string_length,'\0');
  _Var3._M_p = local_78._M_dataplus._M_p;
  sVar6 = checkName->_M_string_length;
  if (sVar6 != 0) {
    pcVar1 = (checkName->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      iVar4 = tolower((int)pcVar1[sVar7]);
      _Var3._M_p[sVar7] = (char)iVar4;
      sVar7 = sVar7 + 1;
    } while (sVar6 != sVar7);
  }
  _Var3._M_p = local_78._M_dataplus._M_p;
  iVar4 = toupper((int)*local_78._M_dataplus._M_p);
  *_Var3._M_p = (char)iVar4;
  if (local_78._M_string_length != 0) {
    sVar6 = 0;
    lVar8 = 0;
    do {
      lVar8 = lVar8 + (ulong)(local_78._M_dataplus._M_p[sVar6] == '-');
      sVar6 = sVar6 + 1;
    } while (local_78._M_string_length != sVar6);
    if (lVar8 != 0) {
      uVar2 = checkName->_M_string_length;
      uVar10 = 0;
      while( true ) {
        sVar6 = local_78._M_string_length;
        _Var3._M_p = local_78._M_dataplus._M_p;
        uVar9 = 0xffffffffffffffff;
        if (uVar10 <= local_78._M_string_length && local_78._M_string_length - uVar10 != 0) {
          pvVar5 = memchr(local_78._M_dataplus._M_p + uVar10,0x2d,local_78._M_string_length - uVar10
                         );
          uVar9 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)_Var3._M_p;
        }
        _Var3._M_p = local_78._M_dataplus._M_p;
        if (uVar2 <= uVar9) break;
        uVar10 = uVar9 + 1;
        iVar4 = toupper((int)local_78._M_dataplus._M_p[uVar9 + 1]);
        _Var3._M_p[uVar9 + 1] = (char)iVar4;
      }
      if (sVar6 == 0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        pvVar5 = memchr(local_78._M_dataplus._M_p,0x2d,sVar6);
        uVar10 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)_Var3._M_p;
      }
      local_38 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (uVar10 == 0xffffffffffffffff) {
        sVar6 = 0;
      }
      else {
        sVar6 = 0;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_58,&local_78,sVar6,uVar10 - sVar6);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          _Var3._M_p = local_78._M_dataplus._M_p;
          sVar6 = uVar10 + 1;
          uVar10 = 0xffffffffffffffff;
          if (sVar6 <= local_78._M_string_length && local_78._M_string_length - sVar6 != 0) {
            pvVar5 = memchr(local_78._M_dataplus._M_p + sVar6,0x2d,local_78._M_string_length - sVar6
                           );
            uVar10 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)_Var3._M_p;
          }
        } while (uVar10 != 0xffffffffffffffff);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_58,&local_78,sVar6,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0018b637;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_78._M_string_length;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
LAB_0018b637:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TidyConfigParser::formatCheckName(const std::string& checkName) {
    if (checkName.empty())
        return "";
    std::string capitalizedName;
    capitalizedName.resize(checkName.size());
    std::transform(checkName.begin(), checkName.end(), capitalizedName.begin(), ::tolower);
    // Input string is expected to have the format a-b-c-d-e...
    // Capitalize the first letter
    capitalizedName[0] = static_cast<char>(::toupper(capitalizedName[0]));
    if (std::count(capitalizedName.begin(), capitalizedName.end(), '-') == 0) {
        // If there are no '-' on the name, we are done
        return capitalizedName;
    }

    // Find all the '-' and capitalize the following char if exists
    auto nameLength = checkName.size();
    size_t pos = 0;
    while (true) {
        pos = capitalizedName.find('-', pos);
        // If pos+1 does not exist, or we have not found anymore '-' we can break.
        // Else capitalize the pos+1 letter
        if (pos == std::string::npos || nameLength <= pos)
            break;
        else {
            capitalizedName[pos + 1] = static_cast<char>(::toupper(capitalizedName[pos + 1]));
            pos += 1;
        }
    }

    // At this point the string should have the format Aa-Bb-Cc-....
    // Remove the '-' from the string and we are done
    size_t currentPos = 0;
    size_t nextPos = capitalizedName.find('-');
    std::string name;
    while (nextPos != std::string::npos) {
        name.append(capitalizedName.substr(currentPos, nextPos - currentPos));
        currentPos = nextPos + 1;
        nextPos = capitalizedName.find('-', currentPos);
    }
    name.append(capitalizedName.substr(currentPos));
    return name;
}